

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontStructMatrix.cpp
# Opt level: O1

void __thiscall
TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
::Assemble(TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
           *this,TPZBaseMatrix *stiff_base,TPZBaseMatrix *rhs_base,
          TPZAutoPointer<TPZGuiInterface> *guiInterface)

{
  TPZCompEl *el;
  int iVar1;
  long lVar2;
  int64_t size;
  TPZCompEl **ppTVar3;
  long *plVar4;
  ostream *poVar5;
  undefined1 *puVar6;
  undefined1 *puVar7;
  long lVar8;
  long nelem;
  long lVar9;
  TPZVec<int> elorder;
  TPZElementMatrixT<std::complex<double>_> ef;
  TPZElementMatrixT<std::complex<double>_> ek;
  int iStack_10414;
  undefined1 *puStack_10410;
  TPZCompMesh *pTStack_10408;
  TPZFMatrix<std::complex<double>_> *pTStack_10400;
  TPZMatrix<std::complex<double>_> *pTStack_103f8;
  TPZVec<int> TStack_103f0;
  TPZElementMatrixT<std::complex<double>_> TStack_103d0;
  TPZElementMatrixT<std::complex<double>_> local_8200;
  
  lVar2 = __dynamic_cast(stiff_base,&TPZBaseMatrix::typeinfo,
                         &TPZMatrix<std::complex<double>>::typeinfo,0);
  if ((lVar2 == 0) ||
     (lVar2 = __dynamic_cast(rhs_base,&TPZBaseMatrix::typeinfo,
                             &TPZFMatrix<std::complex<double>>::typeinfo,0), lVar2 != 0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "virtual void TPZFrontStructMatrix<TPZFrontSym<std::complex<double>>, std::complex<double>>::Assemble(TPZBaseMatrix &, TPZBaseMatrix &, TPZAutoPointer<TPZGuiInterface>) [TFront = TPZFrontSym<std::complex<double>>, TVar = std::complex<double>, TPar = TPZStructMatrixOR<CSTATE>]"
               ,0x113);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," incompatible types. Aborting...\n",0x21);
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/StrMatrix/TPZFrontStructMatrix.cpp"
               ,0x145);
  }
  pTStack_103f8 =
       (TPZMatrix<std::complex<double>_> *)
       __dynamic_cast(stiff_base,&TPZBaseMatrix::typeinfo,&TPZMatrix<std::complex<double>>::typeinfo
                      ,0);
  if ((pTStack_103f8 == (TPZMatrix<std::complex<double>_> *)0x0) ||
     (pTStack_10400 =
           (TPZFMatrix<std::complex<double>_> *)
           __dynamic_cast(rhs_base,&TPZBaseMatrix::typeinfo,
                          &TPZFMatrix<std::complex<double>>::typeinfo,0),
     pTStack_10400 == (TPZFMatrix<std::complex<double>_> *)0x0)) {
    __cxa_bad_cast();
  }
  lVar2 = ((*(TPZCompMesh **)&this->field_0x8)->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.
          fNElements;
  TPZElementMatrixT<std::complex<double>_>::TPZElementMatrixT
            (&local_8200,*(TPZCompMesh **)&this->field_0x8,EK);
  TPZElementMatrixT<std::complex<double>_>::TPZElementMatrixT
            (&TStack_103d0,*(TPZCompMesh **)&this->field_0x8,EF);
  pTStack_10408 = *(TPZCompMesh **)&this->field_0x8;
  size = TPZCompMesh::NEquations(pTStack_10408);
  iStack_10414 = 0;
  TPZVec<int>::TPZVec(&TStack_103f0,size,&iStack_10414);
  OrderElement(this);
  if (0 < lVar2) {
    pTStack_10408 = (TPZCompMesh *)&pTStack_10408->fElementVec;
    puStack_10410 = &this->field_0x20;
    lVar9 = 0;
    lVar8 = 0;
    do {
      nelem = (long)(this->fElementOrder).fStore[lVar9];
      if (-1 < nelem) {
        ppTVar3 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                            ((TPZChunkVector<TPZCompEl_*,_10> *)pTStack_10408,nelem);
        el = *ppTVar3;
        if (el != (TPZCompEl *)0x0) {
          plVar4 = (long *)(**(code **)(*(long *)el + 0xb8))(el);
          if ((plVar4 != (long *)0x0) &&
             (iVar1 = (**(code **)(*plVar4 + 0x58))(plVar4), *(int *)&this->field_0x40 != 0)) {
            puVar6 = puStack_10410;
            for (puVar7 = *(undefined1 **)&this->field_0x28; puVar7 != (undefined1 *)0x0;
                puVar7 = *(undefined1 **)
                          (puVar7 + (ulong)(*(int *)(puVar7 + 0x20) < iVar1) * 8 + 0x10)) {
              if (iVar1 <= *(int *)(puVar7 + 0x20)) {
                puVar6 = puVar7;
              }
            }
            puVar7 = puStack_10410;
            if ((puVar6 != puStack_10410) && (puVar7 = puVar6, iVar1 < *(int *)(puVar6 + 0x20))) {
              puVar7 = puStack_10410;
            }
            if (puVar7 == puStack_10410) goto LAB_0138f631;
          }
          (**(code **)(*(long *)el + 0x110))(el,&local_8200,&TStack_103d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout," assemblando elemento frontal ",0x1e);
          poVar5 = std::ostream::_M_insert<long>((long)&std::cout);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          AssembleElement(this,el,&local_8200.super_TPZElementMatrix,
                          &TStack_103d0.super_TPZElementMatrix,pTStack_103f8,pTStack_10400);
          if (this->f_quiet == 0) {
            iStack_10414 = CONCAT31(iStack_10414._1_3_,0x2a);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,(char *)&iStack_10414,1);
            if ((lVar8 * -0x3333333333333333 + 0x1999999999999998U >> 2 |
                lVar8 * -0x3333333333333333 << 0x3e) < 0xccccccccccccccd) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
              poVar5 = std::ostream::_M_insert<long>((long)&std::cout);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar5,"% Elements assembled ",0x15);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
              std::ostream::put((char)poVar5);
              std::ostream::flush();
              std::ostream::flush();
            }
          }
          lVar8 = lVar8 + 1;
        }
      }
LAB_0138f631:
      lVar9 = lVar9 + 1;
    } while (lVar9 != lVar2);
  }
  TStack_103f0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  if (TStack_103f0.fStore != (int *)0x0) {
    operator_delete__(TStack_103f0.fStore);
  }
  TStack_103d0.super_TPZElementMatrix._vptr_TPZElementMatrix =
       (_func_int **)&PTR__TPZElementMatrixT_0194d820;
  TPZBlock::~TPZBlock(&TStack_103d0.fConstrBlock);
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix
            (&TStack_103d0.fConstrMat.super_TPZFMatrix<std::complex<double>_>,&PTR_PTR_01887fd8);
  TPZBlock::~TPZBlock(&TStack_103d0.fBlock);
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix
            (&TStack_103d0.fMat.super_TPZFMatrix<std::complex<double>_>,&PTR_PTR_01887fd8);
  TPZElementMatrix::~TPZElementMatrix(&TStack_103d0.super_TPZElementMatrix);
  local_8200.super_TPZElementMatrix._vptr_TPZElementMatrix =
       (_func_int **)&PTR__TPZElementMatrixT_0194d820;
  TPZBlock::~TPZBlock(&local_8200.fConstrBlock);
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix
            (&local_8200.fConstrMat.super_TPZFMatrix<std::complex<double>_>,&PTR_PTR_01887fd8);
  TPZBlock::~TPZBlock(&local_8200.fBlock);
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix
            (&local_8200.fMat.super_TPZFMatrix<std::complex<double>_>,&PTR_PTR_01887fd8);
  TPZElementMatrix::~TPZElementMatrix(&local_8200.super_TPZElementMatrix);
  return;
}

Assistant:

void TPZFrontStructMatrix<TFront,TVar,TPar>::Assemble(TPZBaseMatrix & stiff_base, TPZBaseMatrix & rhs_base, TPZAutoPointer<TPZGuiInterface> guiInterface){
    if(!dynamic_cast<TPZMatrix<TVar>*>(&stiff_base) ||
       dynamic_cast<TPZFMatrix<TVar>*>(&rhs_base)){
        PZError<<__PRETTY_FUNCTION__;
        PZError<<" incompatible types. Aborting...\n";
        DebugStop();
    }
	auto& stiffness = dynamic_cast<TPZMatrix<TVar>&>(stiff_base);
    auto& rhs = dynamic_cast<TPZFMatrix<TVar>&>(rhs_base);
	int64_t iel;
	int64_t numel = 0, nelem = this->fMesh->NElements();
	TPZElementMatrixT<TVar> ek(this->fMesh,TPZElementMatrix::EK),ef(this->fMesh,TPZElementMatrix::EF);
	
	TPZAdmChunkVector<TPZCompEl *> &elementvec = this->fMesh->ElementVec();
	
	
	/**Rearange elements order*/
	TPZVec<int> elorder(this->fMesh->NEquations(),0);
	
	OrderElement();
	
	for(iel=0; iel < nelem; iel++) {
		
        int64_t elindex = fElementOrder[iel];
		if(elindex < 0) continue;
		TPZCompEl *el = elementvec[elindex];
		if(!el) continue;
		TPZMaterial * mat = el->Material();
		if(mat)
		{
			int matid = mat->Id();
			if(this->ShouldCompute(matid) == false)
			{
				continue;
			}
		}
		else
		{
		}
		
		//		int dim = el->NumNodes();
		
		//Builds elements stiffness matrix
		el->CalcStiff(ek,ef);
		
		
		std::cout<< " assemblando elemento frontal " << iel <<std::endl;
		
#ifdef PZ_LOG
        if (logger.isDebugEnabled())
		{
			std::stringstream sout;
			ek.fMat.Print("Element stiffness Frontal",sout);
			LOGPZ_DEBUG(logger,sout.str())
		}
#endif
		
		AssembleElement(el, ek, ef, stiffness, rhs);
#ifdef PZ_LOG
		if(loggerel.isDebugEnabled())
		{
			std::stringstream sout;
			ek.fMat.Print("Element stiffness depois de assemblada ",sout);
			LOGPZ_DEBUG(loggerel,sout.str())
		}
#endif
		
		if(!f_quiet)
		{
			cout << '*';
			if(!(numel%20)) {
				cout << " " << (100*iel/nelem) << "% Elements assembled " << endl;
				cout.flush();
			}
		}
		numel++;
		
	}//fim for iel
	
}